

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

VP8StatusCode IDecode(WebPIDecoder *idec)

{
  VP8Io *pVVar1;
  size_t *psVar2;
  VP8BitReader *token_br;
  VP8BitReader *pVVar3;
  uint8_t **ppuVar4;
  VP8MB VVar5;
  VP8MB VVar6;
  WebPDecBuffer *pWVar7;
  void *pvVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined8 uVar13;
  int iVar14;
  VP8StatusCode VVar15;
  VP8StatusCode VVar16;
  VP8LDecoder *pVVar17;
  size_t sVar18;
  VP8Decoder *pVVar19;
  uint8_t *puVar20;
  WebPWorkerInterface *pWVar21;
  uint uVar22;
  DecState DVar24;
  uint3 *data;
  ulong uVar25;
  size_t sVar26;
  int height;
  int width;
  int local_7c;
  WebPHeaderStructure local_78;
  uint32_t uVar23;
  
  DVar24 = idec->state;
  if (DVar24 == STATE_WEBP_HEADER) {
    local_78.data_size = (idec->mem).start;
    local_78.data = (idec->mem).buf + local_78.data_size;
    local_78.data_size = (idec->mem).end - local_78.data_size;
    local_78.have_all_data = 0;
    VVar15 = WebPParseHeaders(&local_78);
    if (VVar15 == VP8_STATUS_OK) {
      idec->chunk_size =
           CONCAT44(local_78.compressed_size._4_4_,(undefined4)local_78.compressed_size);
      idec->is_lossless = local_78.is_lossless;
      if (local_78.is_lossless == 0) {
        pVVar19 = VP8New();
        if (pVVar19 == (VP8Decoder *)0x0) goto LAB_00107b15;
        pVVar19->incremental = 1;
        idec->dec = pVVar19;
        pVVar19->alpha_data =
             (uint8_t *)CONCAT44(local_78.alpha_data._4_4_,local_78.alpha_data._0_4_);
        pVVar19->alpha_data_size =
             CONCAT44(local_78.alpha_data_size._4_4_,(undefined4)local_78.alpha_data_size);
        sVar26 = (idec->mem).end;
        sVar18 = (idec->mem).start + CONCAT44(local_78.offset._4_4_,(undefined4)local_78.offset);
        idec->state = STATE_VP8_HEADER;
        (idec->mem).start = sVar18;
        (idec->io).data = (idec->mem).buf + sVar18;
        (idec->io).data_size = sVar26 - sVar18;
      }
      else {
        pVVar17 = VP8LNew();
        if (pVVar17 == (VP8LDecoder *)0x0) {
LAB_00107b15:
          VVar16 = VP8_STATUS_OUT_OF_MEMORY;
          goto LAB_00107b1a;
        }
        idec->dec = pVVar17;
        sVar26 = (idec->mem).end;
        sVar18 = (idec->mem).start + CONCAT44(local_78.offset._4_4_,(undefined4)local_78.offset);
        idec->state = STATE_VP8L_HEADER;
        (idec->mem).start = sVar18;
        (idec->io).data = (idec->mem).buf + sVar18;
        (idec->io).data_size = sVar26 - sVar18;
      }
      VVar16 = VP8_STATUS_OK;
    }
    else {
      VVar16 = VP8_STATUS_SUSPENDED;
      if (VVar15 != VP8_STATUS_NOT_ENOUGH_DATA) {
        if (idec->state == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec,&idec->io);
        }
        idec->state = STATE_ERROR;
        VVar16 = VVar15;
      }
    }
LAB_00107b1a:
    DVar24 = idec->state;
  }
  else {
    VVar16 = VP8_STATUS_SUSPENDED;
    if (idec->dec == (void *)0x0) {
      return VP8_STATUS_SUSPENDED;
    }
  }
  if (DVar24 == STATE_VP8_HEADER) {
    sVar26 = (idec->mem).start;
    uVar25 = (idec->mem).end - sVar26;
    if (uVar25 < 10) {
      VVar16 = VP8_STATUS_SUSPENDED;
      DVar24 = STATE_VP8_HEADER;
    }
    else {
      data = (uint3 *)((idec->mem).buf + sVar26);
      iVar14 = VP8GetInfo((uint8_t *)data,uVar25,idec->chunk_size,(int *)&local_78,&local_7c);
      if (iVar14 == 0) {
        VVar16 = VP8_STATUS_BITSTREAM_ERROR;
        DVar24 = STATE_ERROR;
        if (idec->state == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec,&idec->io);
        }
      }
      else {
        (idec->mem).part0_size = (ulong)((*data >> 5) + 10);
        (idec->io).data = (uint8_t *)data;
        (idec->io).data_size = uVar25;
        VVar16 = VP8_STATUS_OK;
        DVar24 = STATE_VP8_PARTS0;
      }
      idec->state = DVar24;
    }
  }
  if (DVar24 == STATE_VP8_PARTS0) {
    VVar16 = VP8_STATUS_SUSPENDED;
    if ((idec->mem).part0_size <= (idec->mem).end - (idec->mem).start) {
      pWVar7 = (idec->params).output;
      pVVar19 = (VP8Decoder *)idec->dec;
      pVVar1 = &idec->io;
      iVar14 = VP8GetHeaders(pVVar19,pVVar1);
      if (iVar14 == 0) {
        VVar15 = pVVar19->status;
        DVar24 = idec->state;
        VVar16 = VP8_STATUS_SUSPENDED;
        if ((VVar15 & ~VP8_STATUS_INVALID_PARAM) != VP8_STATUS_SUSPENDED) goto joined_r0x00107f91;
        goto LAB_00107d11;
      }
      VVar15 = WebPAllocateDecBuffer
                         ((idec->io).width,(idec->io).height,(idec->params).options,pWVar7);
      pVVar19->status = VVar15;
      if (VVar15 == VP8_STATUS_OK) {
        iVar14 = VP8GetThreadMethod((idec->params).options,(WebPHeaderStructure *)0x0,
                                    (idec->io).width,(idec->io).height);
        pVVar19->mt_method = iVar14;
        VP8InitDithering((idec->params).options,pVVar19);
        pvVar8 = idec->dec;
        sVar26 = *(long *)((long)pvVar8 + 0x28) - *(long *)((long)pvVar8 + 0x20);
        if (sVar26 == 0) {
          VVar15 = VP8_STATUS_BITSTREAM_ERROR;
LAB_00107fa2:
          pVVar19->status = VVar15;
        }
        else {
          if ((idec->mem).mode == MEM_MODE_APPEND) {
            puVar20 = (uint8_t *)WebPSafeMalloc(1,sVar26);
            if (puVar20 == (uint8_t *)0x0) {
              VVar15 = VP8_STATUS_OUT_OF_MEMORY;
              goto LAB_00107fa2;
            }
            memcpy(puVar20,*(void **)((long)pvVar8 + 0x20),sVar26);
            (idec->mem).part0_buf = puVar20;
            VP8BitReaderSetBuffer((VP8BitReader *)((long)pvVar8 + 0x10),puVar20,sVar26);
          }
          psVar2 = &(idec->mem).start;
          *psVar2 = *psVar2 + sVar26;
          pVVar19->status = VP8_STATUS_OK;
          VVar15 = VP8EnterCritical(pVVar19,pVVar1);
          if (VVar15 == VP8_STATUS_OK) {
            idec->state = STATE_VP8_DATA;
            iVar14 = VP8InitFrame(pVVar19,pVVar1);
            VVar16 = VP8_STATUS_OK;
            DVar24 = idec->state;
            if (iVar14 == 0) {
              VVar15 = pVVar19->status;
              goto joined_r0x00107f91;
            }
            goto LAB_00107d11;
          }
          VVar15 = pVVar19->status;
        }
      }
      goto LAB_001080d8;
    }
  }
  else {
LAB_00107d11:
    if (DVar24 == STATE_VP8_DATA) {
      pVVar19 = (VP8Decoder *)idec->dec;
      if (pVVar19 == (VP8Decoder *)0x0) {
        return VP8_STATUS_SUSPENDED;
      }
      pVVar1 = &idec->io;
      if (pVVar19->ready == 0) {
LAB_00107eb6:
        VP8ExitCritical(pVVar19,pVVar1);
LAB_00107ebb:
        idec->state = STATE_ERROR;
        VVar16 = VP8_STATUS_BITSTREAM_ERROR;
      }
      else {
        iVar14 = pVVar19->mb_y;
        if (iVar14 < pVVar19->mb_h) {
          do {
            if (idec->last_mb_y != iVar14) {
              iVar14 = VP8ParseIntraModeRow(&pVVar19->br,pVVar19);
              if (iVar14 == 0) {
                if (idec->state == STATE_VP8_DATA) {
                  VP8ExitCritical((VP8Decoder *)idec->dec,pVVar1);
                }
                idec->state = STATE_ERROR;
                return VP8_STATUS_BITSTREAM_ERROR;
              }
              idec->last_mb_y = pVVar19->mb_y;
            }
            iVar14 = pVVar19->mb_x;
            if (iVar14 < pVVar19->mb_w) {
              uVar23 = pVVar19->num_parts_minus_one;
              do {
                uVar22 = uVar23 & pVVar19->mb_y;
                token_br = pVVar19->parts + uVar22;
                VVar5 = pVVar19->mb_info[-1];
                VVar6 = pVVar19->mb_info[iVar14];
                pVVar3 = pVVar19->parts + uVar22;
                uVar9 = pVVar3->range;
                uVar10 = pVVar3->bits;
                ppuVar4 = &pVVar19->parts[uVar22].buf;
                puVar20 = *ppuVar4;
                puVar11 = ppuVar4[1];
                ppuVar4 = &pVVar19->parts[uVar22].buf_max;
                puVar12 = *ppuVar4;
                uVar13 = ppuVar4[1];
                local_78.alpha_data._4_4_ = SUB84(puVar12,0);
                local_78.alpha_data_size._0_4_ = (undefined4)((ulong)puVar12 >> 0x20);
                local_78.alpha_data_size._4_4_ = (undefined4)uVar13;
                local_78.compressed_size._0_4_ = (undefined4)((ulong)uVar13 >> 0x20);
                local_78._20_4_ = SUB84(puVar20,0);
                local_78.offset._0_4_ = (undefined4)((ulong)puVar20 >> 0x20);
                local_78.offset._4_4_ = SUB84(puVar11,0);
                local_78.alpha_data._0_4_ = (undefined4)((ulong)puVar11 >> 0x20);
                local_78.data._4_4_ = (undefined4)pVVar3->value;
                local_78.data_size._0_4_ = (undefined4)(pVVar3->value >> 0x20);
                local_78.data_size._4_4_ = uVar9;
                local_78.have_all_data = uVar10;
                iVar14 = VP8DecodeMB(pVVar19,token_br);
                uVar23 = pVVar19->num_parts_minus_one;
                if (iVar14 == 0) {
                  if ((uVar23 != 0) || ((idec->mem).end - (idec->mem).start < 0x1001)) {
                    if (0 < pVVar19->mt_method) {
                      pWVar21 = WebPGetWorkerInterface();
                      iVar14 = (*pWVar21->Sync)(&pVVar19->worker);
                      if (iVar14 == 0) goto LAB_00107f51;
                    }
                    pVVar19->mb_info[-1] = VVar5;
                    pVVar19->mb_info[pVVar19->mb_x] = VVar6;
                    token_br->buf_max =
                         (uint8_t *)
                         CONCAT44((undefined4)local_78.alpha_data_size,local_78.alpha_data._4_4_);
                    *(ulong *)&token_br->eof =
                         CONCAT44((undefined4)local_78.compressed_size,
                                  local_78.alpha_data_size._4_4_);
                    token_br->buf = (uint8_t *)CONCAT44((undefined4)local_78.offset,local_78._20_4_)
                    ;
                    token_br->buf_end =
                         (uint8_t *)CONCAT44(local_78.alpha_data._0_4_,local_78.offset._4_4_);
                    token_br->value = CONCAT44((undefined4)local_78.data_size,local_78.data._4_4_);
                    token_br->range = local_78.data_size._4_4_;
                    token_br->bits = local_78.have_all_data;
                    VVar16 = VP8_STATUS_SUSPENDED;
                    goto LAB_00107fca;
                  }
LAB_00107f51:
                  if (idec->state != STATE_VP8_DATA) goto LAB_00107ebb;
                  pVVar19 = (VP8Decoder *)idec->dec;
                  goto LAB_00107eb6;
                }
                if (uVar23 == 0) {
                  (idec->mem).start = (long)token_br->buf - (long)(idec->mem).buf;
                }
                iVar14 = pVVar19->mb_x + 1;
                pVVar19->mb_x = iVar14;
              } while (iVar14 < pVVar19->mb_w);
            }
            VP8InitScanline(pVVar19);
            iVar14 = VP8ProcessRow(pVVar19,pVVar1);
            if (iVar14 == 0) {
              if (idec->state == STATE_VP8_DATA) {
                VP8ExitCritical((VP8Decoder *)idec->dec,pVVar1);
              }
              goto LAB_00107fbf;
            }
            iVar14 = pVVar19->mb_y + 1;
            pVVar19->mb_y = iVar14;
          } while (iVar14 < pVVar19->mb_h);
        }
        iVar14 = VP8ExitCritical(pVVar19,pVVar1);
        if (iVar14 == 0) {
LAB_00107fbf:
          idec->state = STATE_ERROR;
          VVar16 = VP8_STATUS_USER_ABORT;
        }
        else {
          pVVar19->ready = 0;
          VVar16 = FinishDecoding(idec);
        }
      }
LAB_00107fca:
      DVar24 = idec->state;
    }
    if (DVar24 == STATE_VP8L_HEADER) {
      uVar25 = (idec->mem).end - (idec->mem).start;
      pVVar17 = (VP8LDecoder *)idec->dec;
      if (idec->chunk_size >> 3 <= uVar25) {
        pWVar7 = (idec->params).output;
        iVar14 = VP8LDecodeHeader(pVVar17,&idec->io);
        if (iVar14 == 0) {
          VVar15 = pVVar17->status;
          if (VVar15 == VP8_STATUS_BITSTREAM_ERROR) {
            if (uVar25 < idec->chunk_size) goto LAB_00107ffc;
          }
          else {
            VVar16 = VP8_STATUS_SUSPENDED;
            if ((VVar15 & ~VP8_STATUS_INVALID_PARAM) == VP8_STATUS_SUSPENDED) goto LAB_00108009;
          }
        }
        else {
          VVar15 = WebPAllocateDecBuffer
                             ((idec->io).width,(idec->io).height,(idec->params).options,pWVar7);
          pVVar17->status = VVar15;
          if (VVar15 == VP8_STATUS_OK) {
            idec->state = STATE_VP8L_DATA;
            goto LAB_00108015;
          }
        }
LAB_001080d8:
        DVar24 = idec->state;
joined_r0x00107f91:
        if (DVar24 == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec,&idec->io);
        }
        idec->state = STATE_ERROR;
        return VVar15;
      }
LAB_00107ffc:
      pVVar17->status = VP8_STATUS_SUSPENDED;
      VVar16 = VP8_STATUS_SUSPENDED;
    }
  }
LAB_00108009:
  if (idec->state != STATE_VP8L_DATA) {
    return VVar16;
  }
LAB_00108015:
  pVVar17 = (VP8LDecoder *)idec->dec;
  pVVar17->incremental = (uint)((idec->mem).end - (idec->mem).start < idec->chunk_size);
  iVar14 = VP8LDecodeImage(pVVar17);
  VVar15 = pVVar17->status;
  if (iVar14 == 0) {
    VVar16 = VP8_STATUS_SUSPENDED;
    if ((VVar15 & ~VP8_STATUS_INVALID_PARAM) != VP8_STATUS_SUSPENDED) {
      if (idec->state == STATE_VP8_DATA) {
        VP8ExitCritical((VP8Decoder *)idec->dec,&idec->io);
      }
      idec->state = STATE_ERROR;
      VVar16 = VVar15;
    }
  }
  else {
    VVar16 = VP8_STATUS_SUSPENDED;
    if (VVar15 != VP8_STATUS_SUSPENDED) {
      VVar16 = FinishDecoding(idec);
    }
  }
  return VVar16;
}

Assistant:

static VP8StatusCode IDecode(WebPIDecoder* idec) {
  VP8StatusCode status = VP8_STATUS_SUSPENDED;

  if (idec->state == STATE_WEBP_HEADER) {
    status = DecodeWebPHeaders(idec);
  } else {
    if (idec->dec == NULL) {
      return VP8_STATUS_SUSPENDED;    // can't continue if we have no decoder.
    }
  }
  if (idec->state == STATE_VP8_HEADER) {
    status = DecodeVP8FrameHeader(idec);
  }
  if (idec->state == STATE_VP8_PARTS0) {
    status = DecodePartition0(idec);
  }
  if (idec->state == STATE_VP8_DATA) {
    const VP8Decoder* const dec = (VP8Decoder*)idec->dec;
    if (dec == NULL) {
      return VP8_STATUS_SUSPENDED;  // can't continue if we have no decoder.
    }
    status = DecodeRemaining(idec);
  }
  if (idec->state == STATE_VP8L_HEADER) {
    status = DecodeVP8LHeader(idec);
  }
  if (idec->state == STATE_VP8L_DATA) {
    status = DecodeVP8LData(idec);
  }
  return status;
}